

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

void envy_bios_print_mem_train_ptrn(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  ushort uVar2;
  envy_bios_mem_train_ptrn_entry *peVar3;
  long lVar4;
  ushort *puVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  char *__format;
  uint uVar9;
  uint uVar10;
  uint local_54;
  uint local_50;
  uint local_4c;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  uVar2 = (bios->mem).train_ptrn.offset;
  if ((mask >> 0xc & 1) != 0 && uVar2 != 0) {
    fprintf((FILE *)out,"MEM TRAIN PATTERN table at 0x%x, version %x\n",(ulong)uVar2,
            (ulong)(bios->mem).train_ptrn.version);
    envy_bios_dump_hex(bios,out,(uint)(bios->mem).train_ptrn.offset,
                       (uint)(bios->mem).train_ptrn.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    uVar6 = 0;
    while (uVar6 < (bios->mem).train_ptrn.entriesnum) {
      peVar3 = (bios->mem).train_ptrn.entries;
      lVar8 = uVar6 * 6;
      local_48 = uVar6;
      fprintf((FILE *)out,"Set %2i: %u bits, modulo %u",uVar6,(ulong)peVar3[uVar6].bits,
              (ulong)peVar3[uVar6].modulo);
      peVar3 = (bios->mem).train_ptrn.entries;
      __format = ". indirect(%2d)\n";
      lVar4 = (ulong)peVar3[uVar6].indirect_entry * 6;
      if (peVar3[uVar6].indirect == '\0') {
        __format = ". direct(%2d)\n";
        lVar4 = lVar8;
      }
      puVar5 = (ushort *)((long)&peVar3->offset + lVar4);
      bVar1 = (byte)puVar5[1];
      local_4c = (uint)*puVar5;
      fprintf((FILE *)out,__format);
      envy_bios_dump_hex(bios,out,(uint)(bios->mem).train_ptrn.entries[uVar6].offset,
                         (uint)(bios->mem).train_ptrn.rlen,mask);
      if ((int)mask < 0) {
        fputc(10,(FILE *)out);
      }
      local_38 = (ulong)~(uint)(-1L << (bVar1 & 0x3f));
      local_40 = lVar8;
      for (uVar7 = 0; peVar3 = (bios->mem).train_ptrn.entries, uVar7 < (&peVar3->modulo)[lVar8];
          uVar7 = uVar7 + 1) {
        puVar5 = (ushort *)((long)&peVar3->offset + lVar8);
        uVar9 = uVar7;
        if ((char)puVar5[2] != '\0') {
          uVar2 = puVar5[1];
          uVar9 = (byte)uVar2 * uVar7;
          bios_u32(bios,(uint)(bios->mem).train_ptrn.rlen + (uint)*puVar5 + (uVar9 >> 3),&local_54);
          uVar9 = local_54 >> ((byte)uVar9 & 7) & ~(uint)(-1L << ((byte)uVar2 & 0x3f));
          lVar8 = local_40;
        }
        uVar10 = uVar9 * bVar1;
        local_54 = uVar9;
        bios_u32(bios,(uVar10 >> 3 & 0xffff) + (bios->mem).train_ptrn.rlen + local_4c,&local_50);
        local_50 = local_50 >> ((byte)uVar10 & 7) & (uint)local_38;
        fprintf((FILE *)out,"  %2u: [%08x]\n",(ulong)uVar9,(ulong)local_50);
      }
      fputc(10,(FILE *)out);
      uVar6 = local_48 + 1;
    }
  }
  return;
}

Assistant:

void
envy_bios_print_mem_train_ptrn(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mem_train_ptrn *mtp = &bios->mem.train_ptrn;
	int i, j;
	uint32_t data, idx;
	uint16_t data_off;
	uint8_t bits;

	if (!mtp->offset || !(mask & ENVY_BIOS_PRINT_MEM))
		return;

	fprintf(out, "MEM TRAIN PATTERN table at 0x%x, version %x\n", mtp->offset, mtp->version);
	envy_bios_dump_hex(bios, out, mtp->offset, mtp->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < mtp->entriesnum; i++) {
		data_off = mtp->entries[i].offset;
		bits = mtp->entries[i].bits;
		fprintf(out, "Set %2i: %u bits, modulo %u", i, mtp->entries[i].bits, mtp->entries[i].modulo);
		if (mtp->entries[i].indirect) {
			data_off = mtp->entries[mtp->entries[i].indirect_entry].offset;
			bits = mtp->entries[mtp->entries[i].indirect_entry].bits;
			fprintf(out, ". indirect(%2d)\n", mtp->entries[i].indirect_entry);
		} else {
			data_off = mtp->entries[i].offset;
			bits = mtp->entries[i].bits;
			fprintf(out, ". direct(%2d)\n", mtp->entries[i].indirect_entry);
		}
		envy_bios_dump_hex(bios, out, mtp->entries[i].offset, mtp->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

		for (j = 0; j < mtp->entries[i].modulo; j++) {
			uint32_t p_bits;
			uint32_t mask;
			uint16_t off;
			uint8_t  mod;

			if (mtp->entries[i].indirect) {
				p_bits = j * mtp->entries[i].bits;
				mask = (1ULL << mtp->entries[i].bits) - 1;
				off = p_bits / 8;
				mod = p_bits % 8;

				bios_u32(bios, mtp->entries[i].offset + mtp->rlen + off, &idx);
				idx = idx >> mod;
				idx = idx & mask;
			} else {
				idx = j;
			}

			p_bits = idx * bits;
			mask = (1ULL << bits) - 1;
			off = p_bits / 8;
			mod = p_bits % 8;

			bios_u32(bios, data_off + mtp->rlen + off, &data);
			data = data >> mod;
			data = data & mask;

			fprintf(out, "  %2u: [%08x]\n", idx, data);
		}
		fprintf(out, "\n");
	}

}